

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.cpp
# Opt level: O3

Proto * LoadFunction(LoadState *S,TString *p)

{
  StkId *ppTVar1;
  unsigned_short *puVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  GCObject *pt;
  StkId pTVar6;
  TString *pTVar7;
  TValue *pTVar8;
  Table *pTVar9;
  Node *pNVar10;
  ulong uVar11;
  Proto *pPVar12;
  LocVar *pLVar13;
  GCObject *pGVar14;
  TString **ppTVar15;
  long lVar16;
  lua_State *plVar17;
  size_t nsize;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  char x_6;
  char x_4;
  char x;
  char x_1;
  char x_2;
  char x_3;
  lua_Number x_5;
  char local_3e;
  undefined1 local_3d;
  lu_byte local_3c;
  lu_byte local_3b;
  lu_byte local_3a;
  lu_byte local_39;
  undefined8 local_38;
  
  plVar17 = S->L;
  uVar4 = *(int *)&plVar17->nCcalls + 1;
  plVar17->nCcalls = (unsigned_short)uVar4;
  if (200 < (uVar4 & 0xffff)) {
    luaO_pushfstring(plVar17,"%s: %s in precompiled chunk",S->name,"code too deep");
    luaD_throw(S->L,3);
    plVar17 = S->L;
  }
  pt = (GCObject *)luaF_newproto(plVar17);
  pTVar6 = S->L->top;
  (pTVar6->value).gc = pt;
  pTVar6->tt = 9;
  plVar17 = S->L;
  pTVar6 = plVar17->top;
  if ((long)plVar17->stack_last - (long)pTVar6 < 0x11) {
    luaD_growstack(plVar17,1);
    plVar17 = S->L;
    pTVar6 = plVar17->top;
  }
  plVar17->top = pTVar6 + 1;
  pTVar7 = LoadString(S);
  if (pTVar7 != (TString *)0x0) {
    p = pTVar7;
  }
  (pt->p).source = p;
  iVar5 = LoadInt(S);
  (pt->p).linedefined = iVar5;
  iVar5 = LoadInt(S);
  (pt->p).lastlinedefined = iVar5;
  LoadBlock(S,&local_3c,1);
  (pt->p).nups = local_3c;
  LoadBlock(S,&local_3b,1);
  (pt->p).numparams = local_3b;
  LoadBlock(S,&local_3a,1);
  (pt->p).is_vararg = local_3a;
  LoadBlock(S,&local_39,1);
  (pt->p).maxstacksize = local_39;
  iVar5 = LoadInt(S);
  if (iVar5 < -1) {
    pTVar8 = (TValue *)luaM_toobig(S->L);
  }
  else {
    pTVar8 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar5 << 2);
  }
  (pt->h).array = pTVar8;
  (pt->p).sizecode = iVar5;
  LoadBlock(S,pTVar8,(long)iVar5 << 2);
  uVar4 = LoadInt(S);
  if ((int)uVar4 < -1) {
    pTVar9 = (Table *)luaM_toobig(S->L);
    (pt->h).metatable = pTVar9;
    (pt->p).sizek = uVar4;
  }
  else {
    pTVar8 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar4 << 4);
    (pt->p).k = pTVar8;
    (pt->p).sizek = uVar4;
    auVar3 = _DAT_0011d290;
    if (0 < (int)uVar4) {
      lVar16 = (ulong)uVar4 - 1;
      auVar18._8_4_ = (int)lVar16;
      auVar18._0_8_ = lVar16;
      auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
      lVar16 = 0;
      auVar18 = auVar18 ^ _DAT_0011d290;
      auVar22 = _DAT_0011d270;
      auVar21 = _DAT_0011d280;
      do {
        auVar23 = auVar21 ^ auVar3;
        iVar5 = auVar18._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar5 && auVar18._0_4_ < auVar23._0_4_ ||
                    iVar5 < auVar23._4_4_) & 1)) {
          *(undefined4 *)((long)&pTVar8->tt + lVar16) = 0;
        }
        if ((auVar23._12_4_ != auVar18._12_4_ || auVar23._8_4_ <= auVar18._8_4_) &&
            auVar23._12_4_ <= auVar18._12_4_) {
          *(undefined4 *)((long)&pTVar8[1].tt + lVar16) = 0;
        }
        auVar23 = auVar22 ^ auVar3;
        iVar24 = auVar23._4_4_;
        if (iVar24 <= iVar5 && (iVar24 != iVar5 || auVar23._0_4_ <= auVar18._0_4_)) {
          *(undefined4 *)((long)&pTVar8[2].tt + lVar16) = 0;
          *(undefined4 *)((long)&pTVar8[3].tt + lVar16) = 0;
        }
        lVar20 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar20 + 4;
        lVar20 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar20 + 4;
        lVar16 = lVar16 + 0x40;
      } while ((ulong)(uVar4 + 3 >> 2) << 6 != lVar16);
      if (0 < (int)uVar4) {
        lVar16 = 0;
        do {
          pTVar9 = (pt->h).metatable;
          LoadBlock(S,&local_3d,1);
          switch(local_3d) {
          case 0:
            *(undefined4 *)((long)&pTVar9->tt + lVar16) = 0;
            break;
          case 1:
            LoadBlock(S,&local_3e,1);
            *(uint *)((long)&pTVar9->next + lVar16) = (uint)(local_3e != '\0');
            *(undefined4 *)((long)&pTVar9->tt + lVar16) = 1;
            break;
          default:
            luaO_pushfstring(S->L,"%s: %s in precompiled chunk",S->name,"bad constant");
            luaD_throw(S->L,3);
            break;
          case 3:
            LoadBlock(S,&local_38,8);
            *(undefined8 *)((long)&pTVar9->next + lVar16) = local_38;
            *(undefined4 *)((long)&pTVar9->tt + lVar16) = 3;
            break;
          case 4:
            pTVar7 = LoadString(S);
            *(TString **)((long)&pTVar9->next + lVar16) = pTVar7;
            *(undefined4 *)((long)&pTVar9->tt + lVar16) = 4;
          }
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar4 << 4 != lVar16);
      }
    }
  }
  uVar4 = LoadInt(S);
  if ((int)uVar4 < -1) {
    pNVar10 = (Node *)luaM_toobig(S->L);
    (pt->h).node = pNVar10;
    (pt->p).sizep = uVar4;
  }
  else {
    pNVar10 = (Node *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar4 << 3);
    (pt->h).node = pNVar10;
    (pt->p).sizep = uVar4;
    if (0 < (int)uVar4) {
      uVar11 = 0;
      do {
        (pt->p).p[uVar11] = (Proto *)0x0;
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
      if (0 < (int)uVar4) {
        uVar11 = 0;
        do {
          pPVar12 = LoadFunction(S,(pt->p).source);
          (pt->p).p[uVar11] = pPVar12;
          uVar11 = uVar11 + 1;
        } while (uVar4 != uVar11);
      }
    }
  }
  iVar5 = LoadInt(S);
  if (iVar5 < -1) {
    pNVar10 = (Node *)luaM_toobig(S->L);
    nsize = (long)iVar5 << 2;
  }
  else {
    nsize = (long)iVar5 << 2;
    pNVar10 = (Node *)luaM_realloc_(S->L,(void *)0x0,0,nsize);
  }
  (pt->h).lastfree = pNVar10;
  (pt->p).sizelineinfo = iVar5;
  LoadBlock(S,pNVar10,nsize);
  uVar4 = LoadInt(S);
  if ((int)uVar4 < -1) {
    pGVar14 = (GCObject *)luaM_toobig(S->L);
    (pt->h).gclist = pGVar14;
    (pt->p).sizelocvars = uVar4;
  }
  else {
    pLVar13 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar4 << 4);
    (pt->p).locvars = pLVar13;
    (pt->p).sizelocvars = uVar4;
    auVar3 = _DAT_0011d290;
    if (0 < (int)uVar4) {
      lVar16 = (ulong)uVar4 - 1;
      auVar19._8_4_ = (int)lVar16;
      auVar19._0_8_ = lVar16;
      auVar19._12_4_ = (int)((ulong)lVar16 >> 0x20);
      lVar16 = 0;
      auVar19 = auVar19 ^ _DAT_0011d290;
      auVar23 = _DAT_0011d280;
      do {
        auVar22 = auVar23 ^ auVar3;
        if ((bool)(~(auVar22._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar22._0_4_ ||
                    auVar19._4_4_ < auVar22._4_4_) & 1)) {
          *(undefined8 *)((long)&pLVar13->varname + lVar16) = 0;
        }
        if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
            auVar22._12_4_ <= auVar19._12_4_) {
          *(undefined8 *)((long)&pLVar13[1].varname + lVar16) = 0;
        }
        lVar20 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 2;
        auVar23._8_8_ = lVar20 + 2;
        lVar16 = lVar16 + 0x20;
      } while ((ulong)(uVar4 + 1 >> 1) << 5 != lVar16);
      lVar16 = 0;
      do {
        pTVar7 = LoadString(S);
        *(TString **)((long)&((pt->p).locvars)->varname + lVar16) = pTVar7;
        iVar5 = LoadInt(S);
        *(int *)((long)&((pt->p).locvars)->startpc + lVar16) = iVar5;
        iVar5 = LoadInt(S);
        *(int *)((long)&((pt->p).locvars)->endpc + lVar16) = iVar5;
        lVar16 = lVar16 + 0x10;
      } while ((ulong)uVar4 << 4 != lVar16);
    }
  }
  uVar4 = LoadInt(S);
  if ((int)uVar4 < -1) {
    ppTVar15 = (TString **)luaM_toobig(S->L);
    (pt->p).upvalues = ppTVar15;
    (pt->p).sizeupvalues = uVar4;
  }
  else {
    ppTVar15 = (TString **)luaM_realloc_(S->L,(void *)0x0,0,(long)(int)uVar4 << 3);
    (pt->p).upvalues = ppTVar15;
    (pt->p).sizeupvalues = uVar4;
    if (0 < (int)uVar4) {
      uVar11 = 0;
      do {
        (pt->p).upvalues[uVar11] = (TString *)0x0;
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
      uVar11 = 0;
      do {
        pTVar7 = LoadString(S);
        (pt->p).upvalues[uVar11] = pTVar7;
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
    }
  }
  iVar5 = luaG_checkcode(&pt->p);
  if (iVar5 == 0) {
    luaO_pushfstring(S->L,"%s: %s in precompiled chunk",S->name,"bad code");
    luaD_throw(S->L,3);
  }
  plVar17 = S->L;
  ppTVar1 = &plVar17->top;
  *ppTVar1 = *ppTVar1 + -1;
  puVar2 = &plVar17->nCcalls;
  *puVar2 = *puVar2 - 1;
  return (Proto *)pt;
}

Assistant:

static Proto* LoadFunction(LoadState* S, TString* p)
{
 Proto* f;
 if (++S->L->nCcalls > LUAI_MAXCCALLS) error(S,"code too deep");
 f=luaF_newproto(S->L);
 setptvalue2s(S->L,S->L->top,f); incr_top(S->L);
 f->source=LoadString(S); if (f->source==NULL) f->source=p;
 f->linedefined=LoadInt(S);
 f->lastlinedefined=LoadInt(S);
 f->nups=LoadByte(S);
 f->numparams=LoadByte(S);
 f->is_vararg=LoadByte(S);
 f->maxstacksize=LoadByte(S);
 LoadCode(S,f);
 LoadConstants(S,f);
 LoadDebug(S,f);
 IF (!luaG_checkcode(f), "bad code");
 S->L->top--;
 S->L->nCcalls--;
 return f;
}